

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

optional<pbrt::Bounds2<float>_> * __thiscall
pbrt::PortalImageInfiniteLight::ImageBounds
          (optional<pbrt::Bounds2<float>_> *__return_storage_ptr__,PortalImageInfiniteLight *this,
          Point3f *p)

{
  Point2<float> *p1_00;
  Point2<float> *p2;
  Tuple2<pbrt::Point2,_float> TVar1;
  undefined8 uVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Vector3<float> VVar6;
  optional<pbrt::Point2<float>_> p1;
  optional<pbrt::Point2<float>_> p0;
  undefined1 local_40 [12];
  undefined1 local_34 [12];
  Bounds2<float> local_28;
  
  auVar5 = in_ZMM0._8_56_;
  VVar6 = Point3<float>::operator-((this->portal).values,p);
  local_28.pMax.super_Tuple2<pbrt::Point2,_float>.x = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar5;
  local_28.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar2._0_16_);
  VVar6 = Normalize<float>((Vector3<float> *)&local_28);
  ImageFromRender((PortalImageInfiniteLight *)local_34,
                  (Vector3f)VVar6.super_Tuple3<pbrt::Vector3,_float>,(Float *)this);
  VVar6 = Point3<float>::operator-((this->portal).values + 2,p);
  local_28.pMax.super_Tuple2<pbrt::Point2,_float>.x = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar5;
  local_28.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3._0_16_);
  VVar6 = Normalize<float>((Vector3<float> *)&local_28);
  ImageFromRender((PortalImageInfiniteLight *)local_40,
                  (Vector3f)VVar6.super_Tuple3<pbrt::Vector3,_float>,(Float *)this);
  if ((local_34[8] == true) && (local_40[8] != false)) {
    p1_00 = pstd::optional<pbrt::Point2<float>_>::value((optional<pbrt::Point2<float>_> *)local_34);
    p2 = pstd::optional<pbrt::Point2<float>_>::value((optional<pbrt::Point2<float>_> *)local_40);
    Bounds2<float>::Bounds2(&local_28,p1_00,p2);
    uVar4 = CONCAT44(local_28.pMax.super_Tuple2<pbrt::Point2,_float>.y,
                     local_28.pMax.super_Tuple2<pbrt::Point2,_float>.x);
    __return_storage_ptr__->set = true;
    TVar1 = local_28.pMin.super_Tuple2<pbrt::Point2,_float>;
  }
  else {
    *(undefined4 *)&__return_storage_ptr__->set = 0;
    TVar1.x = 0.0;
    TVar1.y = 0.0;
    uVar4 = 0;
  }
  *(Tuple2<pbrt::Point2,_float> *)&__return_storage_ptr__->optionalValue = TVar1;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uVar4;
  pstd::optional<pbrt::Point2<float>_>::~optional((optional<pbrt::Point2<float>_> *)local_40);
  pstd::optional<pbrt::Point2<float>_>::~optional((optional<pbrt::Point2<float>_> *)local_34);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<Bounds2f> ImageBounds(const Point3f &p) const {
        pstd::optional<Point2f> p0 = ImageFromRender(Normalize(portal[0] - p));
        pstd::optional<Point2f> p1 = ImageFromRender(Normalize(portal[2] - p));
        if (!p0 || !p1)
            return {};
        return Bounds2f(*p0, *p1);
    }